

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormTests.cpp
# Opt level: O3

void __thiscall
MockUserCreateForm::MockUserCreateForm
          (MockUserCreateForm *this,string *firstName,string *lastName,string *email,
          string *password,bool adminStatus)

{
  pointer pcVar1;
  
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).super_Form.errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ModelForm<BaseUser>).instance = (BaseUser *)0x0;
  (this->super_ModelForm<BaseUser>).super_Form._vptr_Form = (_func_int **)&PTR_clean_00140168;
  (this->firstName)._M_dataplus._M_p = (pointer)&(this->firstName).field_2;
  pcVar1 = (firstName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->firstName,pcVar1,pcVar1 + firstName->_M_string_length);
  (this->lastName)._M_dataplus._M_p = (pointer)&(this->lastName).field_2;
  pcVar1 = (lastName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lastName,pcVar1,pcVar1 + lastName->_M_string_length);
  (this->email)._M_dataplus._M_p = (pointer)&(this->email).field_2;
  pcVar1 = (email->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->email,pcVar1,pcVar1 + email->_M_string_length);
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  pcVar1 = (password->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->password,pcVar1,pcVar1 + password->_M_string_length);
  this->adminStatus = adminStatus;
  return;
}

Assistant:

MockUserCreateForm::MockUserCreateForm(const string &firstName, const string &lastName, const string &email,
                                       const string &password, bool adminStatus) : firstName(firstName),
                                                                                   lastName(lastName), email(email),
                                                                                   password(password),
                                                                                   adminStatus(adminStatus) {}